

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-interface6.c
# Opt level: O1

int run_test_udp_multicast_interface6(void)

{
  short sVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  int iVar5;
  undefined1 *puVar6;
  short *psVar7;
  uv_udp_t *puVar8;
  bool bVar9;
  sockaddr_in6 addr;
  sockaddr_in6 baddr;
  uv_udp_send_t req;
  int local_198 [7];
  undefined1 local_17c [28];
  undefined1 local_160 [16];
  uv_udp_t local_150;
  
  iVar2 = uv_interface_addresses(&local_150,local_198);
  if (iVar2 != 0) {
LAB_0018892f:
    run_test_udp_multicast_interface6_cold_1();
    return 1;
  }
  if ((long)local_198[0] < 1) {
    uv_free_interface_addresses();
    goto LAB_0018892f;
  }
  psVar7 = (short *)((long)local_150.data + 0x14);
  uVar3 = 1;
  do {
    sVar1 = *psVar7;
    if (sVar1 == 10) break;
    psVar7 = psVar7 + 0x28;
    bVar9 = uVar3 < (ulong)(long)local_198[0];
    uVar3 = uVar3 + 1;
  } while (bVar9);
  uv_free_interface_addresses(local_150.data);
  if (sVar1 != 10) goto LAB_0018892f;
  puVar8 = (uv_udp_t *)0x198f1b;
  iVar5 = 0x23a3;
  iVar2 = uv_ip6_addr("::1",0x23a3,local_198);
  if (iVar2 == 0) {
    puVar8 = (uv_udp_t *)uv_default_loop();
    iVar5 = 0x55efb0;
    iVar2 = uv_udp_init();
    if (iVar2 != 0) goto LAB_00188940;
    puVar8 = (uv_udp_t *)0x198bfb;
    iVar5 = 0;
    iVar2 = uv_ip6_addr("::",0,local_17c);
    if (iVar2 != 0) goto LAB_00188945;
    puVar8 = &server;
    puVar6 = local_17c;
    iVar2 = uv_udp_bind(&server,puVar6,0);
    iVar5 = (int)puVar6;
    if (iVar2 != 0) goto LAB_0018894a;
    puVar8 = &server;
    iVar5 = 0;
    iVar2 = uv_udp_set_multicast_interface();
    if (iVar2 != 0) goto LAB_0018894f;
    local_160 = uv_buf_init("PING",4);
    iVar5 = 0x55efb0;
    puVar8 = &local_150;
    iVar2 = uv_udp_send(puVar8,&server,local_160,1,local_198,sv_send_cb);
    if (iVar2 != 0) goto LAB_00188954;
    if (close_cb_called != 0) goto LAB_00188959;
    if (sv_send_cb_called != 0) goto LAB_0018895e;
    puVar8 = (uv_udp_t *)uv_default_loop();
    iVar5 = 0;
    uv_run();
    if (sv_send_cb_called != 1) goto LAB_00188963;
    if (close_cb_called != 1) goto LAB_00188968;
    uVar4 = uv_default_loop();
    uv_walk(uVar4,close_walk_cb,0);
    iVar5 = 0;
    uv_run(uVar4);
    puVar8 = (uv_udp_t *)uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_udp_multicast_interface6_cold_2();
LAB_00188940:
    run_test_udp_multicast_interface6_cold_3();
LAB_00188945:
    run_test_udp_multicast_interface6_cold_4();
LAB_0018894a:
    run_test_udp_multicast_interface6_cold_5();
LAB_0018894f:
    run_test_udp_multicast_interface6_cold_6();
LAB_00188954:
    run_test_udp_multicast_interface6_cold_7();
LAB_00188959:
    run_test_udp_multicast_interface6_cold_8();
LAB_0018895e:
    run_test_udp_multicast_interface6_cold_9();
LAB_00188963:
    run_test_udp_multicast_interface6_cold_10();
LAB_00188968:
    run_test_udp_multicast_interface6_cold_11();
  }
  run_test_udp_multicast_interface6_cold_12();
  if (puVar8 == (uv_udp_t *)0x0) {
    sv_send_cb_cold_3();
  }
  else if (iVar5 == 0) {
    puVar8 = (uv_udp_t *)(puVar8->u).reserved[2];
    if (puVar8 == &client || puVar8 == &server) {
      sv_send_cb_called = sv_send_cb_called + 1;
      iVar2 = uv_close(puVar8,close_cb);
      return iVar2;
    }
    goto LAB_001889bb;
  }
  sv_send_cb_cold_1();
LAB_001889bb:
  sv_send_cb_cold_2();
  if (puVar8 == &client || puVar8 == &server) {
    close_cb_called = close_cb_called + 1;
    return (int)CONCAT71(21999,puVar8 == &server);
  }
  close_cb_cold_1();
  iVar2 = uv_is_closing();
  if (iVar2 == 0) {
    iVar2 = uv_close(puVar8,0);
    return iVar2;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(udp_multicast_interface6) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif

  int r;
  uv_udp_send_t req;
  uv_buf_t buf;
  struct sockaddr_in6 addr;
  struct sockaddr_in6 baddr;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip6_addr("::1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip6_addr("::", 0, &baddr));
  r = uv_udp_bind(&server, (const struct sockaddr*)&baddr, 0);
  ASSERT(r == 0);

#if defined(__APPLE__) || defined(__FreeBSD__) || defined(__FreeBSD_kernel__)
  r = uv_udp_set_multicast_interface(&server, "::1%lo0");
#else
  r = uv_udp_set_multicast_interface(&server, NULL);
#endif
  ASSERT(r == 0);

  /* server sends "PING" */
  buf = uv_buf_init("PING", 4);
  r = uv_udp_send(&req,
                  &server,
                  &buf,
                  1,
                  (const struct sockaddr*)&addr,
                  sv_send_cb);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(sv_send_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}